

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::ComputeCoarseStiffness
          (TPZDohrSubstruct<std::complex<float>_> *this)

{
  TPZMatrix<std::complex<float>_> *pTVar1;
  long in_RDI;
  int in_stack_00000034;
  TPZFMatrix<std::complex<float>_> *in_stack_00000038;
  TPZFMatrix<std::complex<float>_> *in_stack_00000040;
  TPZFMatrix<std::complex<float>_> *in_stack_00000048;
  TPZFMatrix<std::complex<float>_> *in_stack_00000050;
  complex<float> in_stack_00000058;
  complex<float> in_stack_00000060;
  TPZFMatrix<std::complex<float>_> temp1;
  complex<float> local_b4;
  complex<float> local_ac;
  int64_t in_stack_ffffffffffffff60;
  int64_t in_stack_ffffffffffffff68;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffffb8;
  
  TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  TPZFMatrix<std::complex<float>_>::Resize
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pTVar1 = TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator->
                     ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)(in_RDI + 0x520));
  (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar1,in_RDI + 0x370,&stack0xffffffffffffff68,0);
  std::complex<float>::complex(&local_ac,1.0,0.0);
  std::complex<float>::complex(&local_b4,0.0,0.0);
  TPZFMatrix<std::complex<float>_>::MultAdd
            (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
             in_stack_00000060,in_stack_00000058,in_stack_00000034);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x1ffff05);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeCoarseStiffness() {
	TPZFMatrix<TVar> temp1(fNEquations,fCoarseIndex.NElements());
	fKCi.Resize(fCoarseIndex.NElements(),fCoarseIndex.NElements());
	fStiffness->Multiply(fPhiC,temp1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		temp1.Print("stiffness matrix times phi",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	fPhiC.MultAdd(temp1,temp1,fKCi,1,0,1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		fKCi.Print("Coarse stiffness matrix",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}